

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lexer.cpp
# Opt level: O0

shared_ptr<TokenStream> __thiscall
TokenStream::tokenize(TokenStream *this,ProgramContext *program,string *data_,char *stream_name)

{
  char *source_data;
  undefined8 __s;
  long lVar1;
  long lVar2;
  size_t begin_pos;
  size_t end_pos;
  TokenStream *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<TokenStream> sVar3;
  char *local_258;
  vector<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_> local_1f0;
  TextStream local_1d8;
  char local_171;
  char *local_170;
  char *line_end;
  char *line_start;
  char *it;
  char *end;
  char *begin;
  allocator<char> local_131;
  string local_130;
  string local_110;
  undefined1 local_f0 [8];
  LexerContext lexer;
  char *stream_name_local;
  string *data__local;
  ProgramContext *program_local;
  
  lexer.line_buffer.field_2._8_8_ = stream_name;
  std::__cxx11::string::string((string *)&local_110,(string *)data_);
  __s = lexer.line_buffer.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,(char *)__s,&local_131);
  LexerContext::LexerContext((LexerContext *)local_f0,program,&local_110,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  std::__cxx11::string::~string((string *)&local_110);
  end = (char *)std::__cxx11::string::c_str();
  lVar1 = std::__cxx11::string::c_str();
  lVar2 = std::__cxx11::string::size();
  it = (char *)(lVar1 + lVar2);
  line_start = end;
  while (line_start != it) {
    line_end = line_start;
    local_171 = '\n';
    local_170 = std::find<char_const*,char>(line_start,it,&local_171);
    source_data = end;
    begin_pos = std::distance<char_const*>(end,line_end);
    end_pos = std::distance<char_const*>(end,local_170);
    lex_line((LexerContext *)local_f0,source_data,begin_pos,end_pos);
    if (local_170 == it) {
      local_258 = local_170;
    }
    else {
      local_258 = std::next<char_const*>(local_170,1);
    }
    line_start = local_258;
  }
  LexerContext::verify_nesting((LexerContext *)local_f0);
  if ((lexer.cpp_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_1_ & 1) == 0) {
    this_00 = (TokenStream *)operator_new(0x90);
    TextStream::TextStream(&local_1d8,(TextStream *)&lexer);
    std::vector<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>::vector
              (&local_1f0,
               (vector<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_> *)
               &lexer.comment_nest_level);
    TokenStream(this_00,program,&local_1d8,&local_1f0);
    std::shared_ptr<TokenStream>::shared_ptr<TokenStream,void>
              ((shared_ptr<TokenStream> *)this,this_00);
    std::vector<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>::~vector
              (&local_1f0);
    TextStream::~TextStream(&local_1d8);
  }
  else {
    std::shared_ptr<TokenStream>::shared_ptr((shared_ptr<TokenStream> *)this,(nullptr_t)0x0);
  }
  LexerContext::~LexerContext((LexerContext *)local_f0);
  sVar3.super___shared_ptr<TokenStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<TokenStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<TokenStream>)sVar3.super___shared_ptr<TokenStream,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TokenStream> TokenStream::tokenize(ProgramContext& program, std::string data_, const char* stream_name)
{
    LexerContext lexer(program, std::move(data_), stream_name);

    auto begin = lexer.stream.data.c_str();
    auto end = lexer.stream.data.c_str() + lexer.stream.data.size();

    for(auto it = begin; it != end; )
    {
        const char *line_start = it;
        const char *line_end   = std::find(it, end, '\n');

        lex_line(lexer, begin, std::distance(begin, line_start), std::distance(begin, line_end));
        it = (line_end == end? line_end : std::next(line_end));
    }

    lexer.verify_nesting();

    if(!lexer.any_error)
        return shared_ptr<TokenStream>(new TokenStream(program, std::move(lexer.stream), std::move(lexer.tokens)));
    else
        return nullptr;
}